

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O1

void __thiscall
CoreML::Specification::CoreMLModels::TextClassifier::CheckTypeAndMergeFrom
          (TextClassifier *this,MessageLite *from)

{
  ulong uVar1;
  LogMessage *other;
  StringVector *pSVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined1 *from_00;
  Arena *arena;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__TextClassifier_004bc500) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::CoreMLModels::TextClassifier *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((TextClassifier *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/TextClassifier.pb.cc"
               ,0x15f);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  uVar4 = (ulong)from[1]._vptr_MessageLite & 0xfffffffffffffffe;
  if (*(long *)(uVar4 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->language_,uVar4,puVar3);
  }
  uVar4 = from[1]._internal_metadata_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar4 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->modelparameterdata_,uVar4,puVar3);
  }
  if (*(uint32_t *)&from[2]._vptr_MessageLite != 0) {
    this->revision_ = *(uint32_t *)&from[2]._vptr_MessageLite;
  }
  if (*(int *)((long)&from[3]._vptr_MessageLite + 4) == 200) {
    if (this->_oneof_case_[0] != 200) {
      clear_ClassLabels(this);
      this->_oneof_case_[0] = 200;
      uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
      arena = (Arena *)(uVar4 & 0xfffffffffffffffc);
      if ((uVar4 & 1) != 0) {
        arena = *(Arena **)arena;
      }
      pSVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                         (arena);
      (this->ClassLabels_).stringclasslabels_ = pSVar2;
    }
    if (*(int *)((long)&from[3]._vptr_MessageLite + 4) == 200) {
      from_00 = (undefined1 *)from[2]._internal_metadata_.ptr_;
    }
    else {
      from_00 = _StringVector_default_instance_;
    }
    StringVector::MergeFrom((this->ClassLabels_).stringclasslabels_,(StringVector *)from_00);
  }
  uVar4 = (from->_internal_metadata_).ptr_;
  if ((uVar4 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar4 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}